

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderCommonFunctionTests.cpp
# Opt level: O0

void __thiscall deqp::gles31::Functional::FmaCase::~FmaCase(FmaCase *this)

{
  FmaCase *this_local;
  
  ~FmaCase(this);
  operator_delete(this,0x280);
  return;
}

Assistant:

FmaCase (Context& context, glu::DataType baseType, glu::Precision precision, glu::ShaderType shaderType)
		: CommonFunctionCase(context, getCommonFuncCaseName(baseType, precision, shaderType).c_str(), "fma", shaderType)
	{
		m_spec.inputs.push_back(Symbol("a", glu::VarType(baseType, precision)));
		m_spec.inputs.push_back(Symbol("b", glu::VarType(baseType, precision)));
		m_spec.inputs.push_back(Symbol("c", glu::VarType(baseType, precision)));
		m_spec.outputs.push_back(Symbol("res", glu::VarType(baseType, precision)));
		m_spec.source = "res = fma(a, b, c);";

		if (!glu::contextSupports(context.getRenderContext().getType(), glu::ApiType::es(3, 2)))
			m_spec.globalDeclarations = "#extension GL_EXT_gpu_shader5 : require\n";
	}